

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TargetParser.cpp
# Opt level: O0

bool llvm::ARM::getHWDivFeatures
               (uint HWDivKind,vector<llvm::StringRef,_std::allocator<llvm::StringRef>_> *Features)

{
  vector<llvm::StringRef,_std::allocator<llvm::StringRef>_> *this;
  value_type local_98;
  value_type local_88;
  value_type local_78;
  value_type local_68;
  vector<llvm::StringRef,_std::allocator<llvm::StringRef>_> *local_58;
  vector<llvm::StringRef,_std::allocator<llvm::StringRef>_> *Features_local;
  uint HWDivKind_local;
  value_type *local_40;
  char *local_38;
  value_type *local_30;
  char *local_28;
  value_type *local_20;
  char *local_18;
  value_type *local_10;
  
  if (HWDivKind == 0) {
    Features_local._7_1_ = false;
  }
  else {
    local_58 = Features;
    Features_local._0_4_ = HWDivKind;
    if ((HWDivKind & 0x20) == 0) {
      local_30 = &local_78;
      local_38 = "-hwdiv-arm";
      local_78.Data = "-hwdiv-arm";
      local_78.Length = strlen("-hwdiv-arm");
      std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::push_back(Features,&local_78);
    }
    else {
      local_40 = &local_68;
      _HWDivKind_local = "+hwdiv-arm";
      local_68.Data = "+hwdiv-arm";
      local_68.Length = strlen("+hwdiv-arm");
      std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::push_back(Features,&local_68);
    }
    this = local_58;
    if (((uint)Features_local & 0x10) == 0) {
      local_10 = &local_98;
      local_18 = "-hwdiv";
      local_98.Data = "-hwdiv";
      local_98.Length = strlen("-hwdiv");
      std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::push_back(this,&local_98);
    }
    else {
      local_20 = &local_88;
      local_28 = "+hwdiv";
      local_88.Data = "+hwdiv";
      local_88.Length = strlen("+hwdiv");
      std::vector<llvm::StringRef,_std::allocator<llvm::StringRef>_>::push_back(this,&local_88);
    }
    Features_local._7_1_ = true;
  }
  return Features_local._7_1_;
}

Assistant:

bool llvm::ARM::getHWDivFeatures(unsigned HWDivKind,
                                 std::vector<StringRef> &Features) {

  if (HWDivKind == ARM::AEK_INVALID)
    return false;

  if (HWDivKind & ARM::AEK_HWDIVARM)
    Features.push_back("+hwdiv-arm");
  else
    Features.push_back("-hwdiv-arm");

  if (HWDivKind & ARM::AEK_HWDIVTHUMB)
    Features.push_back("+hwdiv");
  else
    Features.push_back("-hwdiv");

  return true;
}